

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::reportBasisData(Basis *this)

{
  int iVar1;
  uint uVar2;
  Basis *in_RDI;
  double dVar3;
  double dVar4;
  Basis *in_stack_ffffffffffffffe8;
  Basis *this_00;
  
  this_00 = in_RDI;
  printf("\nBasis data\n");
  uVar2 = factorizations(in_RDI);
  printf("    Num factorizations = %d\n",(ulong)uVar2);
  uVar2 = updates_total(in_RDI);
  printf("    Num updates = %d\n",(ulong)uVar2);
  if (in_RDI->num_ftran_ != 0) {
    uVar2 = in_RDI->num_ftran_;
    in_stack_ffffffffffffffe8 = (Basis *)(in_RDI->sum_ftran_density_ / (double)in_RDI->num_ftran_);
    dVar3 = frac_ftran_sparse(in_RDI);
    printf("    Average density of %7d FTRANs is %6.4f; sparse proportion = %6.4f\n",
           in_stack_ffffffffffffffe8,dVar3,(ulong)uVar2);
  }
  if (in_RDI->num_btran_ != 0) {
    uVar2 = in_RDI->num_btran_;
    dVar3 = in_RDI->sum_btran_density_;
    iVar1 = in_RDI->num_btran_;
    dVar4 = frac_btran_sparse(in_RDI);
    printf("    Average density of %7d BTRANs is %6.4f; sparse proportion = %6.4f\n",
           dVar3 / (double)iVar1,dVar4,(ulong)uVar2);
  }
  mean_fill(this_00);
  printf("    Mean fill-in %11.4g\n");
  max_fill(in_stack_ffffffffffffffe8);
  printf("    Max  fill-in %11.4g\n");
  return;
}

Assistant:

void Basis::reportBasisData() const {
  printf("\nBasis data\n");
  printf("    Num factorizations = %d\n", (int)this->factorizations());
  printf("    Num updates = %d\n", (int)updates_total());
  if (this->num_ftran_) 
    printf("    Average density of %7d FTRANs is %6.4f; sparse proportion = %6.4f\n",
	   (int)this->num_ftran_, this->sum_ftran_density_ / this->num_ftran_, frac_ftran_sparse());
  if (this->num_btran_) 
    printf("    Average density of %7d BTRANs is %6.4f; sparse proportion = %6.4f\n",
	   (int)this->num_btran_, this->sum_btran_density_ / this->num_btran_, frac_btran_sparse());
  printf("    Mean fill-in %11.4g\n", mean_fill());
  printf("    Max  fill-in %11.4g\n", max_fill());

}